

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenBuffer.cpp
# Opt level: O0

void __thiscall antlr::TokenBuffer::rewind(TokenBuffer *this,FILE *__stream)

{
  uint uVar1;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar1 = (uint)__stream;
  syncConsume((TokenBuffer *)CONCAT44(uVar1,in_stack_fffffffffffffff0));
  this->markerOffset = uVar1;
  this->nMarkers = this->nMarkers - 1;
  return;
}

Assistant:

void TokenBuffer::rewind(unsigned int mark)
{
	syncConsume();
	markerOffset=mark;
	nMarkers--;
}